

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

void * unodb::detail::allocate_aligned(size_t size,size_t alignment)

{
  int iVar1;
  bad_alloc *this;
  void *pvStack_20;
  int err;
  void *result;
  size_t alignment_local;
  size_t size_local;
  
  result = (void *)alignment;
  alignment_local = size;
  test::allocation_failure_injector::maybe_fail();
  iVar1 = posix_memalign(&stack0xffffffffffffffe0,(size_t)result,alignment_local);
  if (iVar1 != 0) {
    pvStack_20 = (void *)0x0;
  }
  if (iVar1 == 0x16) {
    __assert_fail("err != 22",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./heap.hpp"
                  ,0x3e,"void *unodb::detail::allocate_aligned(std::size_t, std::size_t)");
  }
  if (pvStack_20 == (void *)0x0 && iVar1 != 0xc) {
    __assert_fail("result != nullptr || err == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./heap.hpp"
                  ,0x40,"void *unodb::detail::allocate_aligned(std::size_t, std::size_t)");
  }
  if (pvStack_20 == (void *)0x0) {
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvStack_20;
}

Assistant:

[[nodiscard]] inline void* allocate_aligned(
    std::size_t size,
    std::size_t alignment = __STDCPP_DEFAULT_NEW_ALIGNMENT__) {
#ifndef NDEBUG
  unodb::test::allocation_failure_injector::maybe_fail();
#endif

  void* result;

#ifndef _MSC_VER
  const auto err = posix_memalign(&result, alignment, size);
  if (UNODB_DETAIL_UNLIKELY(err != 0)) result = nullptr;
#else
  result = _aligned_malloc(size, alignment);
#ifndef NDEBUG
  const auto err = UNODB_DETAIL_LIKELY(result != nullptr) ? 0 : errno;
#endif
#endif

  UNODB_DETAIL_ASSERT(err != EINVAL);
  // NOLINTNEXTLINE(readability-simplify-boolean-expr)
  UNODB_DETAIL_ASSERT(result != nullptr || err == ENOMEM);

  if (UNODB_DETAIL_UNLIKELY(result == nullptr)) {
    throw std::bad_alloc{};  // LCOV_EXCL_LINE
  }

  return result;
}